

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall
summarycalc::reset_ssl_array(summarycalc *this,int summary_set,int sample_size,OASIS_FLOAT **ssl)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int local_28;
  int j;
  int i;
  int maxsummaryids;
  OASIS_FLOAT **ssl_local;
  int sample_size_local;
  int summary_set_local;
  summarycalc *this_local;
  
  iVar1 = this->max_summary_id_[summary_set];
  iVar2 = this->min_summary_id_[summary_set];
  for (local_28 = 0; local_28 <= (iVar1 - iVar2) + 1; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < sample_size + this->num_idx_ + 1; local_2c = local_2c + 1) {
      ssl[local_28][local_2c] = 0.0;
    }
  }
  return;
}

Assistant:

void summarycalc::reset_ssl_array(int summary_set, int sample_size, OASIS_FLOAT **ssl)
{
	int maxsummaryids = max_summary_id_[summary_set] - min_summary_id_[summary_set]+1;
	for (int i = 0; i <= maxsummaryids; i++) {
		for (int j = 0; j < sample_size + num_idx_ + 1; j++) {
			ssl[i][j] = 0;
		}
	}
}